

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O3

void __thiscall
Symbol::SetHasFuncAssignmentInternal(Symbol *this,ByteCodeGenerator *byteCodeGenerator)

{
  ParseableFunctionInfo *pPVar1;
  code *pcVar2;
  bool bVar3;
  uint sourceContextId;
  undefined4 *puVar4;
  FuncInfo *pFVar5;
  FunctionInfo *pFVar6;
  char16_t *reason;
  
  if (this->hasFuncAssignment == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/Symbol.cpp"
                       ,0x9b,"(!hasFuncAssignment)","!hasFuncAssignment");
    if (!bVar3) goto LAB_008a572e;
    *puVar4 = 0;
  }
  this->hasFuncAssignment = true;
  pFVar5 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
  sourceContextId =
       Js::FunctionProxy::GetSourceContextId(&pFVar5->byteCodeFunction->super_FunctionProxy);
  pPVar1 = pFVar5->byteCodeFunction;
  pFVar6 = (pPVar1->super_FunctionProxy).functionInfo.ptr;
  if (pFVar6 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) {
LAB_008a572e:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    pFVar6 = (pPVar1->super_FunctionProxy).functionInfo.ptr;
  }
  bVar3 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015bc490,StackFuncPhase,sourceContextId,pFVar6->functionId);
  if (bVar3) {
    Output::Print(L"HasFuncAssignment: %s\n",(this->name).string.ptr);
    Output::Flush();
  }
  if ((this->hasMaybeEscapedUse == false) && ((this->scope->field_0x44 & 2) == 0)) {
    return;
  }
  pFVar5 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
  if (this->symbolType == STFormal) {
    reason = L"FormalAssignment";
  }
  else {
    reason = L"ObjectScopeAssignment";
    if ((this->scope->field_0x44 & 2) == 0) {
      reason = L"MaybeEscapedUse";
    }
  }
  FuncInfo::SetHasMaybeEscapedNestedFunc(pFVar5,reason);
  return;
}

Assistant:

void Symbol::SetHasFuncAssignmentInternal(ByteCodeGenerator * byteCodeGenerator)
{
    Assert(!hasFuncAssignment);
    hasFuncAssignment = true;
    FuncInfo * top = byteCodeGenerator->TopFuncInfo();
    if (PHASE_TESTTRACE(Js::StackFuncPhase, top->byteCodeFunction))
    {
        Output::Print(_u("HasFuncAssignment: %s\n"), this->GetName().GetBuffer());
        Output::Flush();
    }

    if (this->GetHasMaybeEscapedUse() || this->GetScope()->GetIsObject())
    {
        byteCodeGenerator->TopFuncInfo()->SetHasMaybeEscapedNestedFunc(DebugOnly(
            this->GetIsFormal() ? _u("FormalAssignment") :
            this->GetScope()->GetIsObject() ? _u("ObjectScopeAssignment") :
            _u("MaybeEscapedUse")));
    }
}